

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::areaNavigate(Player *this,int *x,int *y)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_80 [43];
  bool errorOccured;
  int recommendedHit [2];
  undefined1 local_48 [47];
  char direction;
  int *y_local;
  int *x_local;
  Player *this_local;
  
  *x = 1;
  *y = 1;
  unique0x1000022e = y;
  y_local = x;
  x_local = (int *)this;
  UI::clearScreen();
  getName_abi_cxx11_((Player *)local_48);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_48);
  poVar2 = std::operator<<(poVar2,"\'s turn: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_48);
  printPointedEnemyArea(this,*y_local,*stack0xffffffffffffffe0);
  local_48[0x27] = Keyboard::getche();
  bVar1 = getRole(this);
  if (bVar1) {
    local_80[0x23] = 0;
    while (local_48[0x27] != 'e') {
      UI::clearScreen();
      getName_abi_cxx11_((Player *)local_80);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_80);
      poVar2 = std::operator<<(poVar2,"\'s turn: ");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_80);
      switch(local_48[0x27]) {
      case 'a':
        if (1 < *stack0xffffffffffffffe0) {
          *stack0xffffffffffffffe0 = *stack0xffffffffffffffe0 + -1;
        }
        break;
      default:
        local_80[0x23] = 1;
        break;
      case 'd':
        if (*stack0xffffffffffffffe0 < 10) {
          *stack0xffffffffffffffe0 = *stack0xffffffffffffffe0 + 1;
        }
        break;
      case 's':
        if (*y_local < 10) {
          *y_local = *y_local + 1;
        }
        break;
      case 'w':
        if (1 < *y_local) {
          *y_local = *y_local + -1;
        }
      }
      printPointedEnemyArea(this,*y_local,*stack0xffffffffffffffe0);
      if ((local_80[0x23] & 1) != 0) {
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<(poVar2,"[ERROR] Wrong direction");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_80[0x23] = 0;
      }
      local_48[0x27] = Keyboard::getche();
    }
    UI::clearScreen();
  }
  else {
    AI::recommendHitForPlayer(this,(int *)(local_80 + 0x24));
    *y_local = local_80._36_4_;
    *stack0xffffffffffffffe0 = stack0xffffffffffffffa8;
  }
  return;
}

Assistant:

void Player::areaNavigate(int &x, int &y)
{
    char direction;
    x = 1; y = 1;
    UI::clearScreen();
    std::cout << getName() << "'s turn: " << std::endl;
    printPointedEnemyArea(x,y);
    direction = Keyboard::getche();
    if (!getRole()) //if computer plays
    {
        int recommendedHit[2];
        AI::recommendHitForPlayer(*this, recommendedHit);
        x = recommendedHit[0];
        y = recommendedHit[1];
        return;
    }
    bool errorOccured = false;
    while(direction != 'e')
    {
        UI::clearScreen();
        std::cout << getName() << "'s turn: " << std::endl;
        //std::cout << "|" << std::endl;
        switch(direction) {
            case 'w':
                if (x > 1) x--;
                break;
            case 'a':
                if (y > 1) y--;
                break;
            case 's':
                if (x < 10) x++;
                break;
            case 'd':
                if (y < 10) y++;
                break;

            default:
                errorOccured = true;

        }
        printPointedEnemyArea(x,y);
        if (errorOccured) {
            std::cout << std::endl << "[ERROR] Wrong direction" << std::endl;
            errorOccured = false;
        }
        //std::cout << (int) direction;
        direction = Keyboard::getche();
    }
//    UI::clearScreen();
//    std::cout << getName() << "'s turn: " << std::endl;
//    printPointedEnemyArea(x,y);
    //Keyboard::getch();
    UI::clearScreen();

}